

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dwarf.c
# Opt level: O3

int dwarf_lookup_pc(backtrace_state *state,dwarf_data *ddata,uintptr_t pc,
                   backtrace_full_callback callback,backtrace_error_callback error_callback,
                   void *data,int *found)

{
  ulong *puVar1;
  function_addrs *pfVar2;
  unit *u;
  ulong uVar3;
  size_t *__s;
  function *function;
  bool bVar4;
  uintptr_t *puVar5;
  long lVar6;
  long lVar7;
  uchar *puVar8;
  backtrace_error_callback p_Var9;
  undefined1 auVar10 [12];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  backtrace_full_callback p_Var13;
  void *pvVar14;
  uint16_t uVar15;
  uint32_t uVar16;
  int iVar17;
  int iVar18;
  void *pvVar19;
  unit_addrs *puVar20;
  unit_addrs *puVar21;
  unit_addrs *puVar22;
  size_t sVar23;
  undefined8 *puVar24;
  uint64_t uVar25;
  char *pcVar26;
  int64_t iVar27;
  size_t sVar28;
  undefined4 *puVar29;
  void *pvVar30;
  function_addrs *pfVar31;
  function_vector *pfVar32;
  size_t sVar33;
  unit *puVar34;
  function_addrs *pfVar35;
  int iVar36;
  char *pcVar37;
  ulong uVar38;
  long lVar39;
  long lVar40;
  long lVar41;
  uint uVar42;
  line *__base;
  unit **ppuVar43;
  long lVar44;
  long lVar45;
  long lVar46;
  uint uVar47;
  unit_addrs *puVar48;
  char *local_258;
  char *filename;
  uchar *local_248;
  size_t local_240;
  int local_238;
  backtrace_error_callback local_230;
  void *local_228;
  int local_220;
  char *local_190;
  undefined1 local_188 [24];
  char *pcStack_170;
  dwarf_buf local_160;
  unit *local_120;
  undefined1 auStack_118 [8];
  function_vector lvec;
  undefined1 auStack_c8 [8];
  int lineno;
  uint uStack_bc;
  int local_b8;
  uint uStack_b4;
  uint uStack_b0;
  undefined4 uStack_ac;
  undefined1 local_a8 [16];
  undefined1 local_98 [16];
  char **local_88 [2];
  backtrace_full_callback local_78;
  ulong local_70;
  uintptr_t pc_local;
  size_t *local_60;
  backtrace_error_callback local_58;
  char *local_50;
  void *local_48;
  char *local_40;
  function_vector *local_38;
  
  *found = 1;
  if ((pc != 0xffffffffffffffff && ddata->addrs_count != 0) &&
     (local_70 = pc, local_58 = error_callback,
     pvVar19 = bsearch(&local_70,ddata->addrs,ddata->addrs_count,0x18,unit_addrs_search),
     pvVar19 != (void *)0x0)) {
    puVar20 = (unit_addrs *)((long)pvVar19 - 0x30);
    do {
      puVar21 = puVar20 + 1;
      puVar48 = puVar20 + 3;
      puVar20 = puVar21;
    } while (local_70 == puVar48->low);
    do {
      puVar20 = puVar21 + 1;
      if (local_70 < puVar21[1].high) {
        puVar34 = puVar21[1].u;
        __base = puVar34->lines;
        local_78 = callback;
        local_48 = data;
        if ((puVar20 <= ddata->addrs) || (local_70 < puVar21->low)) goto LAB_0012a5ca;
        ppuVar43 = &puVar21->u;
        puVar48 = puVar20;
        goto LAB_0012a577;
      }
    } while ((puVar20 != ddata->addrs) &&
            (puVar5 = &puVar21->low, puVar20 = puVar21 + 1, puVar21 = puVar21 + -1,
            puVar20->low <= *puVar5));
  }
  goto LAB_0012b58a;
  while( true ) {
    if (state->threaded != 0) goto LAB_0012b6c9;
    puVar20 = puVar48;
    if (__base != (line *)0xffffffffffffffff) break;
    puVar48 = (unit_addrs *)(ppuVar43 + -2);
    puVar34 = *ppuVar43;
    __base = puVar34->lines;
    puVar20 = puVar22;
    if (puVar48 <= ddata->addrs) break;
    puVar1 = (ulong *)(ppuVar43 + -5);
    puVar21 = puVar22 + -1;
    ppuVar43 = ppuVar43 + -3;
    puVar20 = puVar48;
    puVar48 = puVar22;
    if (local_70 < *puVar1) break;
LAB_0012a577:
    puVar22 = puVar21;
    if (ppuVar43[-1] <= local_70) {
      puVar20 = (unit_addrs *)(ppuVar43 + 1);
      break;
    }
  }
LAB_0012a5ca:
  if (state->threaded != 0) goto LAB_0012b6c9;
  if (__base == (line *)0xffffffffffffffff) {
LAB_0012b5be:
    pcVar37 = (char *)0x0;
  }
  else {
    if (__base == (line *)0x0) {
      u = puVar20->u;
      local_188._0_16_ = (undefined1  [16])0x0;
      stack0xfffffffffffffe88 = (undefined1  [16])0x0;
      _auStack_c8 = (undefined1  [16])0x0;
      _local_b8 = (undefined1  [16])0x0;
      local_a8 = (undefined1  [16])0x0;
      local_98 = (undefined1  [16])0x0;
      local_88[0] = (char **)0x0;
      uVar38 = u->lineoff;
      uVar3 = (ddata->dwarf_sections).size[1];
      sVar23 = uVar3 - uVar38;
      local_120 = puVar34;
      if (uVar3 < uVar38 || sVar23 == 0) {
        (*local_58)(data,"unit line offset out of range",0);
LAB_0012b347:
        pvVar19 = local_48;
        p_Var9 = local_58;
        local_188._16_8_ = local_188._16_8_ + local_188._8_8_;
        local_188._8_8_ = 0;
        tcmalloc_backtrace_vector_release(state,(backtrace_vector *)local_188,local_58,local_48);
        free_line_header(state,(line_header *)auStack_c8,p_Var9,pvVar19);
        __base = (line *)0xffffffffffffffff;
        bVar4 = true;
        pfVar35 = (function_addrs *)0x0;
        pcVar37 = (char *)0x0;
        pcVar26 = (char *)0x0;
      }
      else {
        local_160.name = ".debug_line";
        local_160.start = (ddata->dwarf_sections).data[1];
        local_160.buf = local_160.start + uVar38;
        local_160.is_bigendian = ddata->is_bigendian;
        local_160.error_callback = local_58;
        local_160.reported_underflow = 0;
        local_160.left = sVar23;
        local_160.data = data;
        uVar16 = read_uint32(&local_160);
        if (uVar16 == 0xffffffff) {
          local_160.left = read_uint64(&local_160);
        }
        else {
          local_160.left = (size_t)uVar16;
        }
        uVar15 = read_uint16(&local_160);
        auVar11 = _auStack_c8;
        auStack_c8._0_4_ = CONCAT22(0,uVar15);
        if ((ushort)(uVar15 - 6) < 0xfffc) {
          uVar47 = (int)local_160.buf - (int)local_160.start;
          pcVar37 = "unsupported line number version";
LAB_0012a6fb:
          snprintf((char *)&stack0xfffffffffffffda8,200,"%s in %s at %d",pcVar37,local_160.name,
                   (ulong)uVar47);
          iVar18 = -1;
LAB_0012a720:
          (*local_160.error_callback)(local_160.data,(char *)&stack0xfffffffffffffda8,iVar18);
          goto LAB_0012b347;
        }
        if (uVar15 == 5) {
          local_38 = (function_vector *)local_160.buf;
          iVar18 = advance(&local_160,1);
          if (iVar18 == 0) {
            uVar47 = 0;
          }
          else {
            uVar47 = (uint)*(byte *)&(local_38->vec).base;
          }
          auStack_c8._4_4_ = uVar47;
          local_38 = (function_vector *)local_160.buf;
          iVar18 = advance(&local_160,1);
          if ((iVar18 != 0) && (*(uchar *)&(local_38->vec).base != '\0')) {
            uVar47 = (int)local_160.buf - (int)local_160.start;
            pcVar37 = "non-zero segment_selector_size not supported";
            goto LAB_0012a6fb;
          }
        }
        else {
          _lineno = auVar11._8_8_;
          auStack_c8._4_4_ = u->addrsize;
        }
        if (uVar16 == 0xffffffff) {
          lvec.vec.alc = read_uint64(&local_160);
        }
        else {
          uVar16 = read_uint32(&local_160);
          lvec.vec.alc = (size_t)uVar16;
        }
        iVar18 = local_160.reported_underflow;
        pvVar19 = local_160.data;
        p_Var9 = local_160.error_callback;
        lvec.count = CONCAT44(local_160._36_4_,local_160.is_bigendian);
        lvec.vec.base = local_160.start;
        auStack_118 = (undefined1  [8])local_160.name;
        lvec.vec.size = (size_t)local_160.buf;
        iVar17 = advance(&local_160,lvec.vec.alc);
        if (iVar17 == 0) goto LAB_0012b347;
        sVar23 = lvec.vec.size;
        iVar17 = advance((dwarf_buf *)auStack_118,1);
        auVar11 = _auStack_c8;
        if (iVar17 == 0) {
          uVar47 = 0;
        }
        else {
          uVar47 = (uint)*(byte *)sVar23;
        }
        lineno = uVar47;
        auVar10 = _auStack_c8;
        auVar12 = _auStack_c8;
        uStack_bc = 1;
        auStack_c8._0_4_ = auVar11._0_4_;
        bVar4 = 3 < (int)auStack_c8._0_4_;
        _auStack_c8 = auVar10;
        if (bVar4) {
          sVar23 = lvec.vec.size;
          _auStack_c8 = auVar12;
          iVar17 = advance((dwarf_buf *)auStack_118,1);
          if (iVar17 == 0) {
            uStack_bc = 0;
          }
          else {
            uStack_bc = (uint)*(byte *)sVar23;
          }
        }
        advance((dwarf_buf *)auStack_118,1);
        local_38 = (function_vector *)lvec.vec.size;
        iVar17 = advance((dwarf_buf *)auStack_118,1);
        uVar47 = 0;
        iVar36 = 0;
        if (iVar17 != 0) {
          iVar36 = (int)*(char *)local_38;
        }
        local_b8 = iVar36;
        local_38 = (function_vector *)lvec.vec.size;
        iVar17 = advance((dwarf_buf *)auStack_118,1);
        if (iVar17 != 0) {
          uVar47 = (uint)*(byte *)&(local_38->vec).base;
        }
        uStack_b4 = uVar47;
        sVar23 = lvec.vec.size;
        iVar17 = advance((dwarf_buf *)auStack_118,1);
        if (iVar17 == 0) {
          uVar47 = 0;
        }
        else {
          uVar47 = (uint)*(byte *)sVar23;
        }
        uStack_b0 = uVar47;
        local_a8._0_8_ = lvec.vec.size;
        iVar17 = advance((dwarf_buf *)auStack_118,(ulong)(uVar47 - 1));
        if (iVar17 == 0) goto LAB_0012b347;
        if ((int)auStack_c8._0_4_ < 5) {
          local_a8._8_8_ = 0;
          sVar23 = lvec.vec.size;
          if ((long)lvec.vec.alc < 1) {
            local_a8._8_8_ = 1;
          }
          else {
            lVar44 = 0;
            pcVar37 = (char *)lvec.vec.size;
            do {
              if (*pcVar37 == '\0') break;
              lVar45 = (long)(lvec.vec.alc + lvec.vec.size) - (long)pcVar37;
              if (lVar45 == 0) {
                lVar40 = 1;
              }
              else {
                lVar39 = 0;
                do {
                  lVar40 = lVar39;
                  if (pcVar37[lVar39] == '\0') break;
                  lVar39 = lVar39 + 1;
                  lVar40 = lVar45;
                } while (lVar45 != lVar39);
                lVar40 = lVar40 + 1;
              }
              pcVar37 = pcVar37 + lVar40;
              lVar44 = lVar44 + 1;
              local_a8._8_8_ = lVar44;
            } while (pcVar37 < (char *)(lvec.vec.alc + lvec.vec.size));
            local_a8._8_8_ = lVar44 + 1;
          }
          puVar24 = (undefined8 *)tcmalloc_backtrace_alloc(state,local_a8._8_8_ << 3,p_Var9,pvVar19)
          ;
          local_98._0_8_ = puVar24;
          if (puVar24 != (undefined8 *)0x0) {
            *puVar24 = u->comp_dir;
            if (*(char *)sVar23 != '\0') {
              lVar44 = 8;
              do {
                if (iVar18 != 0) goto LAB_0012b347;
                pcVar37 = read_string((dwarf_buf *)auStack_118);
                *(char **)(local_98._0_8_ + lVar44) = pcVar37;
                if (*(long *)(local_98._0_8_ + lVar44) == 0) goto LAB_0012b347;
                lVar44 = lVar44 + 8;
              } while (*(char *)lvec.vec.size != '\0');
            }
            lVar44 = 1;
            iVar17 = advance((dwarf_buf *)auStack_118,1);
            if (iVar17 != 0) {
              local_98._8_8_ = 0;
              if (0 < (long)lvec.vec.alc) {
                lVar44 = 0;
                pcVar37 = (char *)lvec.vec.size;
                do {
                  if (*pcVar37 == '\0') break;
                  lVar45 = 1;
                  lVar40 = 1;
                  lVar39 = (long)(lvec.vec.alc + lvec.vec.size) - (long)pcVar37;
                  if (lVar39 != 0) {
                    lVar46 = 0;
                    do {
                      lVar40 = lVar46;
                      if (pcVar37[lVar46] == '\0') break;
                      lVar46 = lVar46 + 1;
                      lVar40 = lVar39;
                    } while (lVar39 != lVar46);
                    lVar40 = lVar40 + 1;
                  }
                  if (pcVar37[lVar40] < '\0') {
                    lVar39 = 1;
                    do {
                      lVar45 = lVar39 + 1;
                      lVar46 = lVar39 + lVar40;
                      lVar39 = lVar45;
                    } while (pcVar37[lVar46] < '\0');
                  }
                  lVar6 = lVar45 + lVar40;
                  lVar46 = 1;
                  lVar39 = 1;
                  if (pcVar37[lVar45 + lVar40] < '\0') {
                    lVar41 = 1;
                    do {
                      lVar39 = lVar41 + 1;
                      lVar7 = lVar41 + lVar6;
                      lVar41 = lVar39;
                    } while (pcVar37[lVar7] < '\0');
                  }
                  if (pcVar37[lVar39 + lVar6] < '\0') {
                    lVar41 = 1;
                    do {
                      lVar46 = lVar41 + 1;
                      lVar7 = lVar41 + lVar45 + lVar39 + lVar40;
                      lVar41 = lVar46;
                    } while (pcVar37[lVar7] < '\0');
                  }
                  pcVar37 = pcVar37 + lVar46 + lVar39 + lVar6;
                  lVar44 = lVar44 + 1;
                  local_98._8_8_ = lVar44;
                } while (pcVar37 < (char *)(lvec.vec.alc + lvec.vec.size));
                lVar44 = lVar44 + 1;
              }
              local_38 = (function_vector *)lvec.vec.size;
              local_98._8_8_ = lVar44;
              local_88[0] = (char **)tcmalloc_backtrace_alloc(state,lVar44 << 3,p_Var9,pvVar19);
              if (local_88[0] != (char **)0x0) {
                *local_88[0] = u->filename;
                if (*(uchar *)&(local_38->vec).base != '\0') {
                  lVar44 = 8;
                  do {
                    if ((iVar18 != 0) ||
                       (pcVar37 = read_string((dwarf_buf *)auStack_118), pcVar37 == (char *)0x0))
                    goto LAB_0012b347;
                    uVar25 = read_uleb128((dwarf_buf *)auStack_118);
                    if (*pcVar37 != '/') {
                      if ((ulong)local_a8._8_8_ <= uVar25) {
                        snprintf((char *)&stack0xfffffffffffffda8,200,"%s in %s at %d",
                                 "invalid directory index in line number program header",auStack_118
                                 ,(ulong)(uint)((int)lvec.vec.size - (int)lvec.vec.base));
                        (*p_Var9)(pvVar19,(char *)&stack0xfffffffffffffda8,0);
                        goto LAB_0012b347;
                      }
                      __s = *(size_t **)(local_98._0_8_ + uVar25 * 8);
                      if (__s != (size_t *)0x0) {
                        local_60 = __s;
                        local_38 = (function_vector *)strlen((char *)__s);
                        local_50 = (char *)strlen(pcVar37);
                        pcVar26 = (char *)tcmalloc_backtrace_alloc
                                                    (state,(size_t)(local_50 +
                                                                   (long)((long)&(local_38->vec).
                                                                                 base + 2)),p_Var9,
                                                     pvVar19);
                        if (pcVar26 == (char *)0x0) goto LAB_0012b347;
                        local_40 = pcVar26;
                        memcpy(pcVar26,local_60,(size_t)local_38);
                        local_40[(long)local_38] = '/';
                        memcpy(local_40 + (long)local_38 + 1,pcVar37,(size_t)(local_50 + 1));
                        pcVar37 = local_40;
                      }
                    }
                    *(char **)((long)local_88[0] + lVar44) = pcVar37;
                    read_uleb128((dwarf_buf *)auStack_118);
                    read_uleb128((dwarf_buf *)auStack_118);
                    lVar44 = lVar44 + 8;
                  } while (*(char *)lvec.vec.size != '\0');
                }
                goto LAB_0012aa14;
              }
            }
          }
          goto LAB_0012b347;
        }
        iVar17 = read_line_header_format_entries
                           (state,ddata,u,(dwarf_buf *)auStack_118,(line_header *)auStack_c8,
                            (size_t *)(local_a8 + 8),(char ***)local_98);
        if ((iVar17 == 0) ||
           (iVar17 = read_line_header_format_entries
                               (state,ddata,u,(dwarf_buf *)auStack_118,(line_header *)auStack_c8,
                                (size_t *)(local_98 + 8),local_88), iVar17 == 0)) goto LAB_0012b347;
LAB_0012aa14:
        if (iVar18 != 0) goto LAB_0012b347;
        if ((ulong)local_98._8_8_ < 2) {
          pcVar37 = "";
        }
        else {
          pcVar37 = local_88[0][1];
        }
        if (local_160.left != 0) {
          local_60 = (size_t *)CONCAT44(local_60._4_4_,1);
          local_40 = (char *)0x0;
          local_38 = (function_vector *)0x0;
          local_50 = pcVar37;
          do {
            puVar8 = local_160.buf;
            iVar18 = advance(&local_160,1);
            if (iVar18 == 0) {
              uVar47 = 0;
            }
            else {
              uVar47 = (uint)*(byte *)&((backtrace_vector *)puVar8)->base;
            }
            if (uStack_b0 <= uVar47) {
              uVar42 = (uVar47 - uStack_b0) / uStack_b4 + (int)local_38;
              local_38 = (function_vector *)((ulong)uVar42 % (ulong)uStack_bc);
              local_40 = local_40 + (ulong)(lineno * uVar42) / (ulong)uStack_bc;
              iVar18 = (int)local_60 + local_b8 + (uVar47 - uStack_b0) % uStack_b4;
              local_60 = (size_t *)CONCAT44(local_60._4_4_,iVar18);
LAB_0012ae16:
              add_line(state,ddata,(uintptr_t)local_40,local_50,iVar18,local_160.error_callback,
                       local_160.data,(line_vector *)local_188);
              goto switchD_0012ada8_caseD_6;
            }
            switch((ulong)uVar47) {
            case 0:
              uVar25 = read_uleb128(&local_160);
              pc_local = (uintptr_t)local_160.buf;
              iVar18 = advance(&local_160,1);
              if (iVar18 == 0) {
switchD_0012ae93_default:
                iVar18 = advance(&local_160,uVar25 - 1);
                if (iVar18 != 0) goto LAB_0012ae30;
                goto LAB_0012b347;
              }
              switch(*(byte *)pc_local) {
              case 1:
                local_38 = (function_vector *)0x0;
                local_60 = (size_t *)CONCAT44(local_60._4_4_,(uint)*(byte *)pc_local);
                local_40 = (char *)0x0;
                local_50 = pcVar37;
                break;
              case 2:
                local_40 = (char *)read_address(&local_160,auStack_c8._4_4_);
                break;
              case 3:
                local_50 = read_string(&local_160);
                if (local_50 == (char *)0x0) goto LAB_0012b347;
                pc_local = read_uleb128(&local_160);
                read_uleb128(&local_160);
                read_uleb128(&local_160);
                if (*local_50 != '/') {
                  if ((pc_local & 0xffffffff) < (ulong)local_a8._8_8_) {
                    local_190 = *(char **)(local_98._0_8_ + (pc_local & 0xffffffff) * 8);
                    sVar33 = strlen(local_190);
                    sVar28 = strlen(local_50);
                    pc_local = sVar33;
                    pcVar26 = (char *)tcmalloc_backtrace_alloc
                                                (state,sVar33 + sVar28 + 2,local_160.error_callback,
                                                 local_160.data);
                    if (pcVar26 != (char *)0x0) {
                      memcpy(pcVar26,local_190,pc_local);
                      pcVar26[pc_local] = '/';
                      memcpy(pcVar26 + pc_local + 1,local_50,sVar28 + 1);
                      local_50 = pcVar26;
                      goto LAB_0012ae30;
                    }
                  }
                  else {
                    dwarf_buf_error(&local_160,"invalid directory index in line number program",0);
                  }
                  goto LAB_0012b347;
                }
                break;
              case 4:
                goto switchD_0012ada8_caseD_5;
              default:
                goto switchD_0012ae93_default;
              }
              break;
            case 1:
              iVar18 = (int)local_60;
              goto LAB_0012ae16;
            case 2:
              uVar25 = read_uleb128(&local_160);
              uVar38 = uVar25 + ((ulong)local_38 & 0xffffffff);
              local_40 = local_40 + ((uint)lineno * uVar38) / (ulong)uStack_bc;
              local_38 = (function_vector *)(uVar38 % (ulong)uStack_bc);
              goto LAB_0012ae30;
            case 3:
              iVar27 = read_sleb128(&local_160);
              local_60 = (size_t *)CONCAT44(local_60._4_4_,(int)local_60 + (int)iVar27);
              break;
            case 4:
              uVar25 = read_uleb128(&local_160);
              if ((ulong)local_98._8_8_ <= uVar25) {
                snprintf((char *)&stack0xfffffffffffffda8,200,"%s in %s at %d",
                         "invalid file number in line number program",local_160.name,
                         (ulong)(uint)((int)local_160.buf - (int)local_160.start));
                iVar18 = 0;
                goto LAB_0012a720;
              }
              local_50 = local_88[0][uVar25];
              break;
            case 5:
            case 0xc:
switchD_0012ada8_caseD_5:
              read_uleb128(&local_160);
              break;
            case 6:
            case 7:
            case 10:
            case 0xb:
              break;
            case 8:
              uVar47 = (0xff - uStack_b0) / uStack_b4 + (int)local_38;
              local_40 = local_40 + (ulong)(lineno * uVar47) / (ulong)uStack_bc;
              local_38 = (function_vector *)((ulong)uVar47 % (ulong)uStack_bc);
              break;
            case 9:
              uVar15 = read_uint16(&local_160);
              local_40 = local_40 + uVar15;
              local_38 = (function_vector *)0x0;
              goto LAB_0012ae30;
            default:
              uVar42 = (uint)*(byte *)(local_a8._0_8_ + ((ulong)uVar47 - 1));
              if (*(byte *)(local_a8._0_8_ + ((ulong)uVar47 - 1)) != 0) {
                do {
                  read_uleb128(&local_160);
                  uVar42 = uVar42 - 1;
                } while (uVar42 != 0);
              }
            }
switchD_0012ada8_caseD_6:
LAB_0012ae30:
          } while (local_160.left != 0);
        }
        if (((local_160.reported_underflow != 0) || (pcStack_170 == (char *)0x0)) ||
           (puVar24 = (undefined8 *)
                      tcmalloc_backtrace_vector_grow
                                (state,0x18,local_58,local_48,(backtrace_vector *)local_188),
           puVar24 == (undefined8 *)0x0)) goto LAB_0012b347;
        *puVar24 = 0xffffffffffffffff;
        *(undefined1 (*) [16])(puVar24 + 1) = (undefined1  [16])0x0;
        iVar18 = tcmalloc_backtrace_vector_release
                           (state,(backtrace_vector *)local_188,local_58,local_48);
        if (iVar18 == 0) goto LAB_0012b347;
        __base = (line *)local_188._0_8_;
        tcmalloc_backtrace_qsort((void *)local_188._0_8_,(size_t)pcStack_170,0x18,line_compare);
        iVar18 = state->threaded;
        pc_local = (uintptr_t)&ddata->fvec;
        pfVar32 = (function_vector *)0x0;
        if (iVar18 == 0) {
          pfVar32 = (function_vector *)pc_local;
        }
        puVar34 = puVar20->u;
        local_60 = &pfVar32->count;
        local_38 = (function_vector *)pc_local;
        if (iVar18 != 0) {
          local_60 = &lvec.vec.alc;
          lvec.vec.size = 0;
          lvec.vec.alc = 0;
          _auStack_118 = (undefined1  [16])0x0;
          local_38 = (function_vector *)auStack_118;
        }
        local_50 = pcStack_170;
        local_258 = ".debug_info";
        filename = (char *)(ddata->dwarf_sections).data[0];
        local_248 = puVar34->unit_data;
        local_240 = puVar34->unit_data_len;
        local_238 = ddata->is_bigendian;
        local_230 = local_58;
        local_228 = local_48;
        local_220 = 0;
        local_40 = (char *)0x0;
        do {
          if (local_240 == 0) {
            if ((*local_60 != 0) &&
               (puVar29 = (undefined4 *)
                          tcmalloc_backtrace_vector_grow
                                    (state,0x18,local_58,local_48,&local_38->vec),
               puVar29 != (undefined4 *)0x0)) {
              *puVar29 = 0xffffffff;
              puVar29[1] = 0xffffffff;
              puVar29[2] = 0xffffffff;
              puVar29[3] = 0xffffffff;
              *(undefined8 *)(puVar29 + 4) = 0;
              local_40 = (char *)*local_60;
              if (iVar18 == 0) {
                pfVar35 = (function_addrs *)
                          tcmalloc_backtrace_vector_finish
                                    (state,(backtrace_vector *)pc_local,local_58,local_48);
                if (pfVar35 != (function_addrs *)0x0) {
                  pfVar32->count = 0;
                  goto LAB_0012b67b;
                }
              }
              else {
                iVar18 = tcmalloc_backtrace_vector_release
                                   (state,(backtrace_vector *)auStack_118,local_58,local_48);
                if (iVar18 != 0) {
                  pfVar35 = (function_addrs *)(local_38->vec).base;
LAB_0012b67b:
                  tcmalloc_backtrace_qsort(pfVar35,(size_t)local_40,0x18,function_addrs_compare);
                  goto LAB_0012b6a0;
                }
              }
            }
            pfVar35 = (function_addrs *)0x0;
            local_40 = (char *)0x0;
            goto LAB_0012b6a0;
          }
          iVar17 = read_function_entry(state,ddata,puVar34,0,(dwarf_buf *)&stack0xfffffffffffffda8,
                                       (line_header *)auStack_c8,local_58,local_48,local_38,local_38
                                      );
        } while (iVar17 != 0);
        pfVar35 = (function_addrs *)0x0;
LAB_0012b6a0:
        free_line_header(state,(line_header *)auStack_c8,local_58,local_48);
        bVar4 = false;
        pcVar37 = local_50;
        pcVar26 = local_40;
      }
      if (state->threaded != 0) {
LAB_0012b6c9:
        abort();
      }
      local_120->lines_count = (size_t)pcVar37;
      local_120->function_addrs = pfVar35;
      local_120->function_addrs_count = (size_t)pcVar26;
      local_120->lines = __base;
      if (__base == (line *)0xffffffffffffffff) {
        if (!bVar4) {
          iVar18 = dwarf_lookup_pc(state,ddata,local_70,local_78,local_58,local_48,found);
          return iVar18;
        }
        goto LAB_0012b5be;
      }
    }
    pvVar19 = bsearch(&local_70,__base,puVar20->u->lines_count,0x18,line_search);
    puVar34 = puVar20->u;
    if (pvVar19 != (void *)0x0) {
      if ((puVar34->function_addrs_count != 0) &&
         (pvVar30 = bsearch(&local_70,puVar34->function_addrs,puVar34->function_addrs_count,0x18,
                            function_addrs_search), pvVar14 = local_48, p_Var13 = local_78,
         pvVar30 != (void *)0x0)) {
        pfVar35 = (function_addrs *)((long)pvVar30 + -0x18);
        do {
          pfVar31 = pfVar35 + 1;
          pfVar2 = pfVar35 + 2;
          pfVar35 = pfVar31;
        } while (local_70 == pfVar2->low);
        do {
          if (local_70 < pfVar31->high) {
            function = pfVar31->function;
            local_258 = *(char **)((long)pvVar19 + 8);
            auStack_c8._0_4_ = *(undefined4 *)((long)pvVar19 + 0x10);
            iVar18 = report_inlined_functions
                               (local_70,function,local_78,local_48,&stack0xfffffffffffffda8,
                                (int *)auStack_c8);
            if (iVar18 != 0) {
              return iVar18;
            }
            iVar18 = (*p_Var13)(pvVar14,local_70,local_258,auStack_c8._0_4_,function->name);
            return iVar18;
          }
        } while ((pfVar31 != puVar20->u->function_addrs) &&
                (pfVar35 = pfVar31 + -1, puVar5 = &pfVar31->low, pfVar31 = pfVar31 + -1,
                *puVar5 <= pfVar35->low));
      }
      pcVar37 = *(char **)((long)pvVar19 + 8);
      iVar18 = *(int *)((long)pvVar19 + 0x10);
      goto LAB_0012b5ff;
    }
    pcVar37 = puVar34->abs_filename;
    if (pcVar37 == (char *)0x0) {
      pcVar26 = puVar34->filename;
      if (pcVar26 == (char *)0x0) {
        pcVar37 = (char *)0x0;
      }
      else {
        pcVar37 = pcVar26;
        if ((*pcVar26 != '/') && (local_120 = (unit *)puVar34->comp_dir, local_120 != (unit *)0x0))
        {
          pfVar32 = (function_vector *)strlen(pcVar26);
          sVar33 = strlen((char *)local_120);
          local_38 = pfVar32;
          pcVar37 = (char *)tcmalloc_backtrace_alloc
                                      (state,(size_t)((long)&(pfVar32->vec).base + sVar33 + 2),
                                       local_58,local_48);
          if (pcVar37 == (char *)0x0) {
LAB_0012b58a:
            *found = 0;
            return 0;
          }
          memcpy(pcVar37,local_120,sVar33);
          pcVar37[sVar33] = '/';
          memcpy(pcVar37 + sVar33 + 1,pcVar26,(size_t)((long)&(local_38->vec).base + 1));
          puVar34 = puVar20->u;
        }
      }
      puVar34->abs_filename = pcVar37;
    }
  }
  iVar18 = 0;
LAB_0012b5ff:
  iVar18 = (*local_78)(local_48,local_70,pcVar37,iVar18,(char *)0x0);
  return iVar18;
}

Assistant:

static int
dwarf_lookup_pc (struct backtrace_state *state, struct dwarf_data *ddata,
		 uintptr_t pc, backtrace_full_callback callback,
		 backtrace_error_callback error_callback, void *data,
		 int *found)
{
  struct unit_addrs *entry;
  int found_entry;
  struct unit *u;
  int new_data;
  struct line *lines;
  struct line *ln;
  struct function_addrs *p;
  struct function_addrs *fmatch;
  struct function *function;
  const char *filename;
  int lineno;
  int ret;

  *found = 1;

  /* Find an address range that includes PC.  Our search isn't safe if
     PC == -1, as we use that as a sentinel value, so skip the search
     in that case.  */
  entry = (ddata->addrs_count == 0 || pc + 1 == 0
	   ? NULL
	   : bsearch (&pc, ddata->addrs, ddata->addrs_count,
		      sizeof (struct unit_addrs), unit_addrs_search));

  if (entry == NULL)
    {
      *found = 0;
      return 0;
    }

  /* Here pc >= entry->low && pc < (entry + 1)->low.  The unit_addrs
     are sorted by low, so if pc > p->low we are at the end of a range
     of unit_addrs with the same low value.  If pc == p->low walk
     forward to the end of the range with that low value.  Then walk
     backward and use the first range that includes pc.  */
  while (pc == (entry + 1)->low)
    ++entry;
  found_entry = 0;
  while (1)
    {
      if (pc < entry->high)
	{
	  found_entry = 1;
	  break;
	}
      if (entry == ddata->addrs)
	break;
      if ((entry - 1)->low < entry->low)
	break;
      --entry;
    }
  if (!found_entry)
    {
      *found = 0;
      return 0;
    }

  /* We need the lines, lines_count, function_addrs,
     function_addrs_count fields of u.  If they are not set, we need
     to set them.  When running in threaded mode, we need to allow for
     the possibility that some other thread is setting them
     simultaneously.  */

  u = entry->u;
  lines = u->lines;

  /* Skip units with no useful line number information by walking
     backward.  Useless line number information is marked by setting
     lines == -1.  */
  while (entry > ddata->addrs
	 && pc >= (entry - 1)->low
	 && pc < (entry - 1)->high)
    {
      if (state->threaded)
	lines = (struct line *) backtrace_atomic_load_pointer (&u->lines);

      if (lines != (struct line *) (uintptr_t) -1)
	break;

      --entry;

      u = entry->u;
      lines = u->lines;
    }

  if (state->threaded)
    lines = backtrace_atomic_load_pointer (&u->lines);

  new_data = 0;
  if (lines == NULL)
    {
      struct function_addrs *function_addrs;
      size_t function_addrs_count;
      struct line_header lhdr;
      size_t count;

      /* We have never read the line information for this unit.  Read
	 it now.  */

      function_addrs = NULL;
      function_addrs_count = 0;
      if (read_line_info (state, ddata, error_callback, data, entry->u, &lhdr,
			  &lines, &count))
	{
	  struct function_vector *pfvec;

	  /* If not threaded, reuse DDATA->FVEC for better memory
	     consumption.  */
	  if (state->threaded)
	    pfvec = NULL;
	  else
	    pfvec = &ddata->fvec;
	  read_function_info (state, ddata, &lhdr, error_callback, data,
			      entry->u, pfvec, &function_addrs,
			      &function_addrs_count);
	  free_line_header (state, &lhdr, error_callback, data);
	  new_data = 1;
	}

      /* Atomically store the information we just read into the unit.
	 If another thread is simultaneously writing, it presumably
	 read the same information, and we don't care which one we
	 wind up with; we just leak the other one.  We do have to
	 write the lines field last, so that the acquire-loads above
	 ensure that the other fields are set.  */

      if (!state->threaded)
	{
	  u->lines_count = count;
	  u->function_addrs = function_addrs;
	  u->function_addrs_count = function_addrs_count;
	  u->lines = lines;
	}
      else
	{
	  backtrace_atomic_store_size_t (&u->lines_count, count);
	  backtrace_atomic_store_pointer (&u->function_addrs, function_addrs);
	  backtrace_atomic_store_size_t (&u->function_addrs_count,
					 function_addrs_count);
	  backtrace_atomic_store_pointer (&u->lines, lines);
	}
    }

  /* Now all fields of U have been initialized.  */

  if (lines == (struct line *) (uintptr_t) -1)
    {
      /* If reading the line number information failed in some way,
	 try again to see if there is a better compilation unit for
	 this PC.  */
      if (new_data)
	return dwarf_lookup_pc (state, ddata, pc, callback, error_callback,
				data, found);
      return callback (data, pc, NULL, 0, NULL);
    }

  /* Search for PC within this unit.  */

  ln = (struct line *) bsearch (&pc, lines, entry->u->lines_count,
				sizeof (struct line), line_search);
  if (ln == NULL)
    {
      /* The PC is between the low_pc and high_pc attributes of the
	 compilation unit, but no entry in the line table covers it.
	 This implies that the start of the compilation unit has no
	 line number information.  */

      if (entry->u->abs_filename == NULL)
	{
	  const char *filename;

	  filename = entry->u->filename;
	  if (filename != NULL
	      && !IS_ABSOLUTE_PATH (filename)
	      && entry->u->comp_dir != NULL)
	    {
	      size_t filename_len;
	      const char *dir;
	      size_t dir_len;
	      char *s;

	      filename_len = strlen (filename);
	      dir = entry->u->comp_dir;
	      dir_len = strlen (dir);
	      s = (char *) backtrace_alloc (state, dir_len + filename_len + 2,
					    error_callback, data);
	      if (s == NULL)
		{
		  *found = 0;
		  return 0;
		}
	      memcpy (s, dir, dir_len);
	      /* FIXME: Should use backslash if DOS file system.  */
	      s[dir_len] = '/';
	      memcpy (s + dir_len + 1, filename, filename_len + 1);
	      filename = s;
	    }
	  entry->u->abs_filename = filename;
	}

      return callback (data, pc, entry->u->abs_filename, 0, NULL);
    }

  /* Search for function name within this unit.  */

  if (entry->u->function_addrs_count == 0)
    return callback (data, pc, ln->filename, ln->lineno, NULL);

  p = ((struct function_addrs *)
       bsearch (&pc, entry->u->function_addrs,
		entry->u->function_addrs_count,
		sizeof (struct function_addrs),
		function_addrs_search));
  if (p == NULL)
    return callback (data, pc, ln->filename, ln->lineno, NULL);

  /* Here pc >= p->low && pc < (p + 1)->low.  The function_addrs are
     sorted by low, so if pc > p->low we are at the end of a range of
     function_addrs with the same low value.  If pc == p->low walk
     forward to the end of the range with that low value.  Then walk
     backward and use the first range that includes pc.  */
  while (pc == (p + 1)->low)
    ++p;
  fmatch = NULL;
  while (1)
    {
      if (pc < p->high)
	{
	  fmatch = p;
	  break;
	}
      if (p == entry->u->function_addrs)
	break;
      if ((p - 1)->low < p->low)
	break;
      --p;
    }
  if (fmatch == NULL)
    return callback (data, pc, ln->filename, ln->lineno, NULL);

  function = fmatch->function;

  filename = ln->filename;
  lineno = ln->lineno;

  ret = report_inlined_functions (pc, function, callback, data,
				  &filename, &lineno);
  if (ret != 0)
    return ret;

  return callback (data, pc, filename, lineno, function->name);
}